

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O0

void idx2::Dealloc(decode_data *D)

{
  decode_data *D_local;
  
  (*D->Alloc->_vptr_allocator[2])();
  Dealloc(&D->BrickPool);
  DeallocFileCacheTable(&D->FileCacheTable);
  return;
}

Assistant:

void
Dealloc(decode_data* D)
{
  D->Alloc->DeallocAll();
  Dealloc(&D->BrickPool);
  DeallocFileCacheTable(&D->FileCacheTable);
#if VISUS_IDX2
  Dealloc(&D->FileCache);
#endif
}